

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collider.cxx
# Opt level: O1

void __thiscall glauber::Collider::run_events(Collider *this)

{
  double b;
  int local_3c;
  double local_38;
  
  local_3c = 0;
  if (0 < this->nevents_) {
    do {
      local_38 = sample_impact_param(this);
      Event::compute(&this->event_,
                     (this->nucleusA_)._M_t.
                     super___uniq_ptr_impl<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_glauber::Nucleus_*,_std::default_delete<glauber::Nucleus>_>
                     .super__Head_base<0UL,_glauber::Nucleus_*,_false>._M_head_impl,
                     (this->nucleusB_)._M_t.
                     super___uniq_ptr_impl<glauber::Nucleus,_std::default_delete<glauber::Nucleus>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_glauber::Nucleus_*,_std::default_delete<glauber::Nucleus>_>
                     .super__Head_base<0UL,_glauber::Nucleus_*,_false>._M_head_impl,
                     &this->nucleon_profile_);
      Output::operator()(&this->output_,&local_3c,&local_38,&this->event_);
      local_3c = local_3c + 1;
    } while (local_3c < this->nevents_);
  }
  return;
}

Assistant:

void Collider::run_events() {
  // The main event loop.
  for (int n = 0; n < nevents_; ++n) {
    // Sampling the impact parameter also implicitly prepares the nuclei for
    // event computation, i.e. by sampling nucleon positions and participants.
    double b = sample_impact_param();

    // Pass the prepared nuclei to the Event.  It computes the entropy profile
    // (thickness grid) and other event observables.
    event_.compute(*nucleusA_, *nucleusB_, nucleon_profile_);

    // Write event data.
    output_(n, b, event_);
  }
}